

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::GetTailCallFieldHandlerName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,ParseCardinality card,TypeFormat type_format,
          int tag_length_bytes,Options *options)

{
  Options *options_00;
  char *this_00;
  string local_d0;
  AlphaNum local_b0;
  AlphaNum local_80;
  AlphaNum local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uint)this < 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (card < 10) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (card < 7) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  this_00 = "uint16_t";
  if (type_format == kFixed32) {
    this_00 = "uint8_t";
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  switch(card) {
  case kRepeated:
  case kPacked:
  case 6:
    local_b0.piece_data_ = ", ";
    local_b0.piece_size_ = 2;
    (anonymous_namespace)::TcParserName_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)this_00,options_00);
    local_50.piece_data_ = local_d0._M_dataplus._M_p;
    local_50.piece_size_ = local_d0._M_string_length;
    local_80.piece_data_ = "kNoConversion";
    local_80.piece_size_ = 0xd;
    StrAppend(__return_storage_ptr__,&local_b0,&local_50,&local_80);
    break;
  case 4:
  case 5:
    local_b0.piece_data_ = ", ";
    local_b0.piece_size_ = 2;
    (anonymous_namespace)::TcParserName_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)this_00,options_00);
    local_50.piece_data_ = local_d0._M_dataplus._M_p;
    local_50.piece_size_ = local_d0._M_string_length;
    local_80.piece_data_ = "kZigZag";
    local_80.piece_size_ = 7;
    StrAppend(__return_storage_ptr__,&local_b0,&local_50,&local_80);
    break;
  case 7:
    local_b0.piece_data_ = ", ";
    local_b0.piece_size_ = 2;
    (anonymous_namespace)::TcParserName_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)this_00,options_00);
    local_50.piece_data_ = local_d0._M_dataplus._M_p;
    local_50.piece_size_ = local_d0._M_string_length;
    local_80.piece_data_ = "kNoUtf8";
    local_80.piece_size_ = 7;
    StrAppend(__return_storage_ptr__,&local_b0,&local_50,&local_80);
    break;
  case 8:
    local_b0.piece_data_ = ", ";
    local_b0.piece_size_ = 2;
    (anonymous_namespace)::TcParserName_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)this_00,options_00);
    local_50.piece_data_ = local_d0._M_dataplus._M_p;
    local_50.piece_size_ = local_d0._M_string_length;
    local_80.piece_data_ = "kUtf8";
    local_80.piece_size_ = 5;
    StrAppend(__return_storage_ptr__,&local_b0,&local_50,&local_80);
    break;
  case 9:
    local_b0.piece_data_ = ", ";
    local_b0.piece_size_ = 2;
    (anonymous_namespace)::TcParserName_abi_cxx11_
              (&local_d0,(_anonymous_namespace_ *)this_00,options_00);
    local_50.piece_data_ = local_d0._M_dataplus._M_p;
    local_50.piece_size_ = local_d0._M_string_length;
    local_80.piece_data_ = "kUtf8ValidateOnly";
    local_80.piece_size_ = 0x11;
    StrAppend(__return_storage_ptr__,&local_b0,&local_50,&local_80);
    break;
  default:
    goto switchD_002b754a_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
switchD_002b754a_default:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTailCallFieldHandlerName(ParseCardinality card,
                                        TypeFormat type_format,
                                        int tag_length_bytes,
                                        const Options& options) {
  std::string name;

  // The field implementation functions are prefixed by cardinality:
  //   `Singular` for optional or implicit fields.
  //   `Repeated` for non-packed repeated.
  //   `Packed` for packed repeated.
  switch (card) {
    case ParseCardinality::kSingular:
      name.append("Singular");
      break;
    case ParseCardinality::kOneof:
      name.append("Oneof");
      break;
    case ParseCardinality::kRepeated:
      name.append("Repeated");
      break;
    case ParseCardinality::kPacked:
      name.append("Packed");
      break;
  }

  // Next in the function name is the TypeFormat-specific name.
  switch (type_format) {
    case TypeFormat::kFixed64:
    case TypeFormat::kFixed32:
      name.append("Fixed");
      break;

    case TypeFormat::kVar64:
    case TypeFormat::kVar32:
    case TypeFormat::kSInt64:
    case TypeFormat::kSInt32:
    case TypeFormat::kBool:
      name.append("Varint");
      break;

    case TypeFormat::kBytes:
    case TypeFormat::kString:
    case TypeFormat::kStringValidateOnly:
      name.append("String");
      break;

    default:
      break;
  }

  name.append("<");

  // Determine the numeric layout type for the parser to use, independent of
  // the specific parsing logic used.
  switch (type_format) {
    case TypeFormat::kVar64:
    case TypeFormat::kFixed64:
      name.append("uint64_t, ");
      break;

    case TypeFormat::kSInt64:
      name.append("int64_t, ");
      break;

    case TypeFormat::kVar32:
    case TypeFormat::kFixed32:
      name.append("uint32_t, ");
      break;

    case TypeFormat::kSInt32:
      name.append("int32_t, ");
      break;

    case TypeFormat::kBool:
      name.append("bool, ");
      break;

    default:
      break;
  }

  name.append(CodedTagType(tag_length_bytes));

  switch (type_format) {
    case TypeFormat::kVar64:
    case TypeFormat::kVar32:
    case TypeFormat::kBool:
      StrAppend(&name, ", ", TcParserName(options), "kNoConversion");
      break;

    case TypeFormat::kSInt64:
    case TypeFormat::kSInt32:
      StrAppend(&name, ", ", TcParserName(options), "kZigZag");
      break;

    case TypeFormat::kBytes:
      StrAppend(&name, ", ", TcParserName(options), "kNoUtf8");
      break;

    case TypeFormat::kString:
      StrAppend(&name, ", ", TcParserName(options), "kUtf8");
      break;

    case TypeFormat::kStringValidateOnly:
      StrAppend(&name, ", ", TcParserName(options), "kUtf8ValidateOnly");
      break;

    default:
      break;
  }

  name.append(">");
  return name;
}